

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
::insert_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *column)

{
  Index columnIndex;
  size_type sVar1;
  Dimension local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *column_local;
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
  *this_local;
  
  columnIndex = *(Index *)(this + 0x38);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(column);
  if (sVar1 == 0) {
    local_38 = 0;
  }
  else {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(column);
    local_38 = (int)sVar1 + -1;
  }
  _insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this,column,columnIndex,local_38);
  *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::insert_column(const Container& column)
{
  //TODO: dim not actually stored right now, so either get rid of it or store it again
  _insert(column, nextInsertIndex_, column.size() == 0 ? 0 : column.size() - 1);
  ++nextInsertIndex_;
}